

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaBackend.cpp
# Opt level: O3

bool __thiscall xmrig::CudaBackend::isEnabled(CudaBackend *this)

{
  Config *this_00;
  CudaConfig *pCVar1;
  bool bVar2;
  
  this_00 = Base::config(&this->d_ptr->controller->super_Base);
  pCVar1 = Config::cuda(this_00);
  if ((pCVar1->m_enabled == true) && (CudaLib::m_initialized == '\x01')) {
    bVar2 = (this->d_ptr->devices).
            super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (this->d_ptr->devices).
            super__Vector_base<xmrig::CudaDevice,_std::allocator<xmrig::CudaDevice>_>._M_impl.
            super__Vector_impl_data._M_finish;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool xmrig::CudaBackend::isEnabled() const
{
    return d_ptr->controller->config()->cuda().isEnabled() && CudaLib::isInitialized() && !d_ptr->devices.empty();;
}